

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O3

ref<immutable::rrb<immutable::vector<char,_false,_6>,_true,_5>_> * __thiscall
immutable::ref<immutable::rrb<immutable::vector<char,_false,_6>,_true,_5>_>::operator=
          (ref<immutable::rrb<immutable::vector<char,_false,_6>,_true,_5>_> *this,
          ref<immutable::rrb<immutable::vector<char,_false,_6>,_true,_5>_> *r)

{
  rrb<immutable::vector<char,_false,_6>,_true,_5> *prVar1;
  rrb<immutable::vector<char,_false,_6>,_true,_5> *p_node;
  
  prVar1 = r->ptr;
  if (prVar1 != (rrb<immutable::vector<char,_false,_6>,_true,_5> *)0x0) {
    LOCK();
    (prVar1->_ref_count).super___atomic_base<unsigned_int>._M_i =
         (prVar1->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
    UNLOCK();
  }
  p_node = this->ptr;
  this->ptr = prVar1;
  rrb_details::release<immutable::vector<char,false,6>,5>(p_node);
  return this;
}

Assistant:

ref<T>& ref<T>::operator = (const ref<T>& r)
      {
      ref<T> temp(r);
      swap(temp);
      return *this;
      }